

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O0

feed_db_status_t store_frequency_db(frequency_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_98 [8];
  char qr [110];
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  frequency_t *record_local;
  
  memcpy(local_98,
         "INSERT INTO frequencies (trip_id, start_time, end_time,headway_secs, exact_times) values (?1, ?2, ?3,?4, ?5);"
         ,0x6e);
  sqlite3_prepare_v2(db->conn,local_98,-1,(sqlite3_stmt **)(qr + 0x68),(char **)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,1,record->trip_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,2,record->start_time,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,3,record->end_time,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(stack0xffffffffffffffd8,4,record->headway_secs);
  sqlite3_bind_int(stack0xffffffffffffffd8,5,record->exact_times);
  iVar1 = sqlite3_step(stack0xffffffffffffffd8);
  db->rc = iVar1;
  bVar3 = db->rc == 0x65;
  if (bVar3) {
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  record_local._4_4_ = (feed_db_status_t)bVar3;
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_frequency_db(frequency_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO frequencies ("
                    "trip_id, start_time, end_time,"
                    "headway_secs, exact_times"
                ") values ("
                    "?1, ?2, ?3,"
                    "?4, ?5"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->trip_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->start_time, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->end_time, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 4, record->headway_secs);
    sqlite3_bind_int(stmt, 5, (int)record->exact_times);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}